

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFileImpl
          (DescriptorBuilder *this,FileDescriptorProto *proto,FlatAllocator *alloc)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  RepeatedField<int> *this_01;
  undefined1 uVar1;
  PointerT<google::protobuf::SourceCodeInfo> pSVar2;
  PointerT<char> pcVar3;
  Tables *this_02;
  DescriptorPool *pDVar4;
  OptionsToInterpret *__last;
  OptionsToInterpret *__first;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  bool bVar5;
  int32_t iVar6;
  int iVar7;
  FileDescriptor *pFVar8;
  FeatureSetDefaults *compiled_defaults;
  FeatureResolver *__args;
  Nullable<const_char_*> pcVar9;
  string *psVar10;
  difference_type dVar11;
  RepeatedField<int> *this_03;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar12;
  once_flag *poVar13;
  int *piVar14;
  Base<char> BVar15;
  undefined8 *puVar16;
  Descriptor *pDVar17;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar18
  ;
  EnumDescriptor *pEVar19;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *pVVar20;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *pVVar21;
  FieldDescriptor *pFVar22;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar23;
  FileDescriptor *pFVar24;
  ServiceDescriptor *pSVar25;
  MethodDescriptor *pMVar26;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>_>
  *pVVar27;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FileDescriptor_*,_std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>_>
  pvVar28;
  Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> BVar29;
  Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> BVar30;
  char needle;
  DescriptorBuilder *pDVar31;
  FileDescriptorProto *pFVar32;
  pointer pcVar33;
  void *extraout_RDX;
  FileDescriptorProto *proto_00;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_00;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_01;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_02;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_03;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_04;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_05;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_06;
  EnumDescriptorProto *proto_01;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_07;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_08;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_09;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *paVar34;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_10;
  allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret> *extraout_RDX_11;
  FileDescriptor *result_00;
  PointerT<google::protobuf::FileDescriptorTables> pFVar35;
  int i;
  undefined1 *from;
  size_type sVar36;
  int iVar37;
  int iVar38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar39;
  ErrorLocation location;
  char *pcVar40;
  int i_1;
  long lVar41;
  int i_5;
  undefined1 *this_04;
  long lVar42;
  pointer pOVar43;
  byte bVar44;
  int i_2;
  SourceCodeInfo *info;
  long in_FS_OFFSET;
  string_view element_name;
  string_view haystack;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view name;
  string_view key;
  string_view name_00;
  string_view name_01;
  string_view element_name_03;
  string_view element_name_04;
  FileDescriptor *local_238;
  int local_22c;
  FileDescriptor *local_228;
  RepeatedPtrFieldBase *local_220;
  FileDescriptor *result;
  FileDescriptor *dependency;
  const_iterator local_208;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
  *local_1f8;
  RepeatedPtrFieldBase *local_1f0;
  RepeatedPtrFieldBase *local_1e8;
  FlatAllocator lazy_dep_alloc;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  seen_dependencies;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  weak_deps;
  StatusOr<google::protobuf::FeatureResolver> feature_resolver;
  
  pFVar8 = anon_unknown_24::
           FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::AllocateArray<google::protobuf::FileDescriptor>
                     (&alloc->
                       super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                      ,(int)proto);
  this->file_ = pFVar8;
  result = pFVar8;
  if ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x20) ==
      (undefined1  [232])0x0) {
    pbVar39 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((ulong)(proto->field_0)._impl_.syntax_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pFVar24 = pFVar8;
    if (pbVar39->_M_string_length != 0) {
      bVar5 = std::operator==(pbVar39,"proto2");
      if (!bVar5) {
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((ulong)(proto->field_0)._impl_.syntax_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc),"proto3");
        if (bVar5) {
          this->file_->edition_ = EDITION_PROTO3;
        }
        else {
          this->file_->edition_ = EDITION_UNKNOWN;
          puVar16 = (undefined8 *)
                    ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
          lazy_dep_alloc.
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          .pointers_.payload_.super_Base<char>.value = (PointerT<char>)proto;
          make_error_01.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
          ;
          make_error_01.ptr_.obj = &lazy_dep_alloc;
          element_name_02._M_str = (char *)*puVar16;
          element_name_02._M_len = puVar16[1];
          AddError(this,element_name_02,&proto->super_Message,OTHER,make_error_01);
        }
        goto LAB_00137236;
      }
      pFVar24 = this->file_;
    }
    pFVar24->edition_ = EDITION_PROTO2;
  }
  else {
    pFVar8->edition_ = (proto->field_0)._impl_.edition_;
  }
LAB_00137236:
  compiled_defaults = DescriptorPool::GetFeatureSetDefaults(this->pool_);
  FeatureResolver::Create(&feature_resolver,this->file_->edition_,compiled_defaults);
  if (feature_resolver.super_StatusOrData<google::protobuf::FeatureResolver>.field_0 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1)0x1) {
    __args = absl::lts_20250127::StatusOr<google::protobuf::FeatureResolver>::value
                       (&feature_resolver);
    pDVar31 = this;
    std::optional<google::protobuf::FeatureResolver>::emplace<google::protobuf::FeatureResolver>
              (&this->feature_resolver_,__args);
    needle = (char)pDVar31;
  }
  else {
    puVar16 = (undefined8 *)
              ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    lazy_dep_alloc.
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    .pointers_.payload_.super_Base<char>.value = (PointerT<char>)&feature_resolver;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
    ;
    make_error.ptr_.obj = &lazy_dep_alloc;
    element_name._M_str = (char *)*puVar16;
    element_name._M_len = puVar16[1];
    pFVar32 = proto;
    AddError(this,element_name,&proto->super_Message,EDITIONS,make_error);
    needle = (char)pFVar32;
  }
  pFVar8->is_placeholder_ = false;
  pFVar8->finished_building_ = false;
  bVar5 = FileDescriptorProto::has_source_code_info(proto);
  if (bVar5) {
    if ((alloc->
        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&lazy_dep_alloc,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1b0,"has_allocated()");
      goto LAB_00138862;
    }
    pSVar2 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
    iVar38 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).used_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
    iVar37 = iVar38 + 1;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value = iVar37;
    pcVar9 = absl::lts_20250127::log_internal::Check_LEImpl
                       (iVar37,(alloc->
                               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                               ).total_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value,
                        "used <= total_.template Get<TypeToUse>()");
    if (pcVar9 != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&lazy_dep_alloc,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1b6,pcVar9);
      goto LAB_00138862;
    }
    this_04 = (undefined1 *)(pSVar2 + iVar38);
    from = (undefined1 *)(proto->field_0)._impl_.source_code_info_;
    if ((SourceCodeInfo *)from == (SourceCodeInfo *)0x0) {
      from = _SourceCodeInfo_default_instance_;
    }
    SourceCodeInfo::CopyFrom((SourceCodeInfo *)this_04,(SourceCodeInfo *)from);
    info = (SourceCodeInfo *)this_04;
  }
  else {
    this_04 = _SourceCodeInfo_default_instance_;
    info = (SourceCodeInfo *)0x0;
  }
  pFVar8->source_code_info_ = (SourceCodeInfo *)this_04;
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value == (PointerT<char>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&lazy_dep_alloc,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x1b0,"has_allocated()");
    goto LAB_00138862;
  }
  pFVar35 = (alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).pointers_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  iVar38 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).used_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  iVar37 = iVar38 + 1;
  (alloc->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).used_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value = iVar37;
  pcVar9 = absl::lts_20250127::log_internal::Check_LEImpl
                     (iVar37,(alloc->
                             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                             ).total_.payload_.super_Base<google::protobuf::FileDescriptorTables>.
                             value,"used <= total_.template Get<TypeToUse>()");
  if (pcVar9 != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&lazy_dep_alloc,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x1b6,pcVar9);
    goto LAB_00138862;
  }
  pFVar35 = pFVar35 + iVar38;
  this->file_tables_ = pFVar35;
  this->file_->tables_ = pFVar35;
  if ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x1) ==
      (undefined1  [232])0x0) {
    pFVar32 = proto;
    AddError(this,(string_view)(ZEXT816(0x365afc) << 0x40),&proto->super_Message,OTHER,
             "Missing field: FileDescriptorProto.name.");
    needle = (char)pFVar32;
  }
  pbVar39 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  psVar10 = (anonymous_namespace)::
            FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
            ::AllocateStrings<std::__cxx11::string_const&>
                      ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                        *)alloc,pbVar39);
  pFVar8->name_ = psVar10;
  if ((undefined1  [232])((undefined1  [232])proto->field_0 & (undefined1  [232])0x2) ==
      (undefined1  [232])0x0) {
    psVar10 = (anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::AllocateStrings<char_const(&)[1]>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)alloc,(char (*) [1])pbVar39);
  }
  else {
    psVar10 = (anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::AllocateStrings<std::__cxx11::string_const&>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)alloc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((ulong)(proto->field_0)._impl_.package_.tagged_ptr_.ptr_ &
                                     0xfffffffffffffffc));
  }
  pFVar8->package_ = psVar10;
  pFVar8->pool_ = this->pool_;
  haystack._M_str = (char *)0x0;
  haystack._M_len = (size_t)(pFVar8->name_->_M_dataplus)._M_p;
  bVar5 = absl::lts_20250127::StrContains
                    ((lts_20250127 *)pFVar8->name_->_M_string_length,haystack,needle);
  if (bVar5) {
    lazy_dep_alloc.
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    .pointers_.payload_.super_Base<char>.value = (PointerT<char>)&result;
    make_error_00.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
    ;
    make_error_00.ptr_.obj = &lazy_dep_alloc;
    element_name_00._M_str = (pFVar8->name_->_M_dataplus)._M_p;
    element_name_00._M_len = pFVar8->name_->_M_string_length;
    AddError(this,element_name_00,&proto->super_Message,NAME,make_error_00);
  }
  else {
    bVar5 = DescriptorPool::Tables::AddFile(this->tables_,pFVar8);
    if (bVar5) {
      sVar36 = pFVar8->package_->_M_string_length;
      if (sVar36 != 0) {
        pcVar40 = (pFVar8->package_->_M_dataplus)._M_p;
        lazy_dep_alloc.
        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        .pointers_.payload_.super_Base<char>.value._0_1_ = 0x2e;
        dVar11 = std::__count_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar40,pcVar40 + sVar36,(_Iter_equals_val<const_char>)&lazy_dep_alloc);
        pcVar33 = (pFVar8->package_->_M_dataplus)._M_p;
        sVar36 = pFVar8->package_->_M_string_length;
        if (100 < dVar11) {
          location = NAME;
          pcVar40 = "Exceeds Maximum Package Depth";
          goto LAB_00137529;
        }
        name._M_str = pcVar33;
        name._M_len = sVar36;
        AddPackage(this,name,&proto->super_Message,pFVar8,true);
      }
      seen_dependencies.
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 1;
      seen_dependencies.
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           0;
      iVar38 = *(int *)((long)&proto->field_0 + 0x10);
      pFVar8->dependency_count_ = iVar38;
      pcVar3 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).pointers_.payload_.super_Base<char>.value;
      if (pcVar3 == (PointerT<char>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&lazy_dep_alloc,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1b0,"has_allocated()");
LAB_00138862:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&lazy_dep_alloc);
      }
      iVar37 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).used_.payload_.super_Base<char>.value;
      iVar38 = iVar37 + iVar38 * 8;
      (alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).used_.payload_.super_Base<char>.value = iVar38;
      pcVar9 = absl::lts_20250127::log_internal::Check_LEImpl
                         (iVar38,(alloc->
                                 super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                 ).total_.payload_.super_Base<char>.value,
                          "used <= total_.template Get<TypeToUse>()");
      if (pcVar9 != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&lazy_dep_alloc,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1b6,pcVar9);
        goto LAB_00138862;
      }
      pFVar8->dependencies_ = (FileDescriptor **)(pcVar3 + iVar37);
      pFVar8->dependencies_once_ = (once_flag *)0x0;
      local_1f8 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                   *)&this->unused_dependency_;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *)local_1f8);
      local_220 = (RepeatedPtrFieldBase *)&this->tables_;
      weak_deps.
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 1;
      weak_deps.
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           0;
      this_03 = &(proto->field_0)._impl_.weak_dependency_;
      local_228 = pFVar8;
      for (iVar38 = 0; iVar37 = RepeatedField<int>::size(this_03), iVar38 < iVar37;
          iVar38 = iVar38 + 1) {
        iVar6 = FileDescriptorProto::weak_dependency(proto,iVar38);
        local_208.inner_.ctrl_ = (ctrl_t *)CONCAT44(local_208.inner_.ctrl_._4_4_,iVar6);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::emplace<int,_0>((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
                           *)&lazy_dep_alloc,
                          &weak_deps.
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                          ,(int *)&local_208);
      }
      this_00 = &(proto->field_0)._impl_.dependency_;
      bVar44 = 0;
      for (local_22c = 0; iVar38 = *(int *)((long)&proto->field_0 + 0x10), local_22c < iVar38;
          local_22c = local_22c + 1) {
        pVVar12 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                            (&this_00->super_RepeatedPtrFieldBase,local_22c);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::
        emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                    *)&lazy_dep_alloc.
                       super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                   ,&seen_dependencies.
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ,pVVar12);
        if ((char)lazy_dep_alloc.
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                  .pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value == '\0') {
          AddTwiceListedError(this,proto,local_22c);
        }
        this_02 = (Tables *)local_220->tagged_rep_or_elem_;
        pVVar12 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                            (&this_00->super_RepeatedPtrFieldBase,local_22c);
        key._M_str = (pVVar12->_M_dataplus)._M_p;
        key._M_len = pVVar12->_M_string_length;
        dependency = DescriptorPool::Tables::FindFile(this_02,key);
        if (dependency == (FileDescriptor *)0x0) {
          pDVar4 = this->pool_->underlay_;
          if (pDVar4 != (DescriptorPool *)0x0) {
            pVVar12 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                (&this_00->super_RepeatedPtrFieldBase,local_22c);
            name_00._M_str = (pVVar12->_M_dataplus)._M_p;
            name_00._M_len = pVVar12->_M_string_length;
            dependency = DescriptorPool::FindFileByName(pDVar4,name_00);
            goto LAB_001377b1;
          }
          if (local_228 == (FileDescriptor *)0x0) goto LAB_00138789;
LAB_0013785b:
          pDVar4 = this->pool_;
          if (pDVar4->lazily_build_dependencies_ == false) {
            if ((pDVar4->allow_unknown_ != false) ||
               ((pDVar4->enforce_weak_ == false &&
                (bVar5 = absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         ::contains<int>(&weak_deps.
                                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                                         ,&local_22c), bVar5)))) {
              iVar38 = 0;
              memset(&lazy_dep_alloc.
                      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                     ,0,0xe0);
              anon_unknown_24::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::PlanArray<google::protobuf::FileDescriptor>
                        (&lazy_dep_alloc.
                          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,iVar38);
              (anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::PlanArray<std::__cxx11::string>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)&lazy_dep_alloc.
                             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,1);
              (anonymous_namespace)::
              FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
              ::FinalizePlanning<google::protobuf::DescriptorPool::Tables*>
                        ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                          *)&lazy_dep_alloc.
                             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,(Tables **)local_220);
              pDVar4 = this->pool_;
              pVVar12 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                  (&this_00->super_RepeatedPtrFieldBase,local_22c);
              name_01._M_str = (pVVar12->_M_dataplus)._M_p;
              name_01._M_len = pVVar12->_M_string_length;
              dependency = DescriptorPool::NewPlaceholderFileWithMutexHeld
                                     (pDVar4,name_01,
                                      (FlatAllocator *)
                                      &lazy_dep_alloc.
                                       super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                     );
            }
            else {
              AddImportError(this,proto,local_22c);
            }
          }
        }
        else {
LAB_001377b1:
          if (dependency == local_228) goto LAB_00138789;
          if (dependency == (FileDescriptor *)0x0) goto LAB_0013785b;
          if (this->pool_->enforce_dependencies_ == true) {
            lazy_dep_alloc.
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            .pointers_.payload_._0_16_ =
                 absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                 ::find<std::__cxx11::string>
                           ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                             *)&this->pool_->direct_input_files_,
                            (key_arg<std::__cxx11::basic_string<char>_> *)
                            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                            0xfffffffffffffffc));
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ::AssertNotDebugCapacity
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        *)&this->pool_->direct_input_files_);
            local_208.inner_.ctrl_ = (ctrl_t *)0x0;
            bVar5 = absl::lts_20250127::container_internal::operator!=
                              ((const_iterator *)
                               &lazy_dep_alloc.
                                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                               ,&local_208);
            if ((bVar5) && (dependency->public_dependency_count_ == 0)) {
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::emplace<const_google::protobuf::FileDescriptor_*const_&,_0>
                        ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
                          *)&lazy_dep_alloc.
                             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         ,(raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           *)local_1f8,&dependency);
            }
          }
        }
        local_228->dependencies_[local_22c] = dependency;
        bVar44 = bVar44 | dependency == (FileDescriptor *)0x0 &
                          this->pool_->lazily_build_dependencies_;
      }
      if (bVar44 != 0) {
        iVar37 = 0;
        for (lVar41 = 0; lVar41 < iVar38; lVar41 = lVar41 + 1) {
          if (local_228->dependencies_[lVar41] == (FileDescriptor *)0x0) {
            pVVar12 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                (&this_00->super_RepeatedPtrFieldBase,(int)lVar41);
            iVar37 = iVar37 + (int)pVVar12->_M_string_length;
            iVar38 = *(int *)((long)&proto->field_0 + 0x10);
          }
          iVar37 = iVar37 + 1;
        }
        poVar13 = (once_flag *)
                  DescriptorPool::Tables::AllocateBytes
                            ((Tables *)local_220->tagged_rep_or_elem_,iVar37 + 4);
        (poVar13->control_).super___atomic_base<unsigned_int>._M_i = 0;
        local_228->dependencies_once_ = poVar13;
        poVar13 = poVar13 + 1;
        for (lVar41 = 0; lVar41 < *(int *)((long)&proto->field_0 + 0x10); lVar41 = lVar41 + 1) {
          if (result->dependencies_[lVar41] == (FileDescriptor *)0x0) {
            iVar38 = (int)lVar41;
            pVVar12 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                (&this_00->super_RepeatedPtrFieldBase,iVar38);
            pcVar33 = (pVVar12->_M_dataplus)._M_p;
            pVVar12 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                (&this_00->super_RepeatedPtrFieldBase,iVar38);
            memcpy(poVar13,pcVar33,pVVar12->_M_string_length);
            pVVar12 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                (&this_00->super_RepeatedPtrFieldBase,iVar38);
            poVar13 = (once_flag *)
                      ((long)&(poVar13->control_).super___atomic_base<unsigned_int>._M_i +
                      pVVar12->_M_string_length);
          }
          *(undefined1 *)&(poVar13->control_).super___atomic_base<unsigned_int>._M_i = 0;
          poVar13 = (once_flag *)
                    ((long)&(poVar13->control_).super___atomic_base<unsigned_int>._M_i + 1);
        }
      }
      this_01 = &(proto->field_0)._impl_.public_dependency_;
      iVar38 = RepeatedField<int>::size(this_01);
      piVar14 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<int>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar38);
      pFVar8 = result;
      result->public_dependencies_ = piVar14;
      iVar38 = 0;
      for (iVar37 = 0; iVar7 = RepeatedField<int>::size(this_01), iVar37 < iVar7;
          iVar37 = iVar37 + 1) {
        iVar6 = FileDescriptorProto::public_dependency(proto,iVar37);
        if ((iVar6 < 0) || (*(int *)((long)&proto->field_0 + 0x10) <= iVar6)) {
          puVar16 = (undefined8 *)
                    ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
          element_name_03._M_str = (char *)*puVar16;
          element_name_03._M_len = puVar16[1];
          AddError(this,element_name_03,&proto->super_Message,OTHER,
                   "Invalid public dependency index.");
        }
        else {
          lVar41 = (long)iVar38;
          iVar38 = iVar38 + 1;
          pFVar8->public_dependencies_[lVar41] = iVar6;
          if (this->pool_->lazily_build_dependencies_ == false) {
            BVar15.value = (PointerT<char>)FileDescriptor::dependency(pFVar8,iVar6);
            lazy_dep_alloc.
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            .pointers_.payload_.super_Base<char>.value = BVar15.value;
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
            ::erase<google::protobuf::FileDescriptor_const*>
                      (local_1f8,
                       (key_arg<const_google::protobuf::FileDescriptor_*> *)&lazy_dep_alloc);
          }
        }
      }
      pFVar8->public_dependency_count_ = iVar38;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::clear(&(this->dependencies_).
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             );
      if (this->pool_->lazily_build_dependencies_ == false) {
        for (iVar38 = 0; iVar38 < pFVar8->dependency_count_; iVar38 = iVar38 + 1) {
          pFVar24 = FileDescriptor::dependency(pFVar8,iVar38);
          RecordPublicDependencies(this,pFVar24);
        }
      }
      iVar38 = RepeatedField<int>::size(this_03);
      piVar14 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<int>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar38);
      pFVar8->weak_dependencies_ = piVar14;
      iVar38 = 0;
      for (iVar37 = 0; iVar7 = RepeatedField<int>::size(this_03), iVar37 < iVar7;
          iVar37 = iVar37 + 1) {
        iVar6 = FileDescriptorProto::weak_dependency(proto,iVar37);
        if ((iVar6 < 0) || (*(int *)((long)&proto->field_0 + 0x10) <= iVar6)) {
          puVar16 = (undefined8 *)
                    ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
          element_name_04._M_str = (char *)*puVar16;
          element_name_04._M_len = puVar16[1];
          AddError(this,element_name_04,&proto->super_Message,OTHER,"Invalid weak dependency index."
                  );
        }
        else {
          lVar41 = (long)iVar38;
          iVar38 = iVar38 + 1;
          result->weak_dependencies_[lVar41] = iVar6;
          pFVar8 = result;
        }
      }
      pFVar8->weak_dependency_count_ = iVar38;
      iVar38 = *(int *)((long)&proto->field_0 + 0x28);
      pFVar8->message_type_count_ = iVar38;
      pDVar17 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::Descriptor>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar38);
      pFVar8->message_types_ = pDVar17;
      local_228 = (FileDescriptor *)&(proto->field_0)._impl_.message_type_;
      lVar41 = 0;
      for (lVar42 = 0; lVar42 < *(int *)((long)&proto->field_0 + 0x28); lVar42 = lVar42 + 1) {
        pVVar18 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                            ((RepeatedPtrFieldBase *)local_228,(int)lVar42);
        pFVar8 = result;
        BuildMessage(this,pVVar18,(Descriptor *)0x0,
                     (Descriptor *)(&result->message_types_->super_SymbolBase + lVar41),alloc);
        lVar41 = lVar41 + 0xa0;
      }
      iVar38 = *(int *)((long)&proto->field_0 + 0x40);
      pFVar8->enum_type_count_ = iVar38;
      pEVar19 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::EnumDescriptor>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar38);
      pFVar8->enum_types_ = pEVar19;
      local_220 = &(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase;
      lVar41 = 0;
      for (lVar42 = 0; lVar42 < *(int *)((long)&proto->field_0 + 0x40); lVar42 = lVar42 + 1) {
        pVVar20 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                            (local_220,(int)lVar42);
        pFVar8 = result;
        BuildEnum(this,pVVar20,(Descriptor *)0x0,
                  (EnumDescriptor *)(&result->enum_types_->super_SymbolBase + lVar41),alloc);
        lVar41 = lVar41 + 0x58;
      }
      iVar38 = *(int *)((long)&proto->field_0 + 0x58);
      pFVar8->service_count_ = iVar38;
      pcVar3 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).pointers_.payload_.super_Base<char>.value;
      if (pcVar3 == (PointerT<char>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&lazy_dep_alloc,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1b0,"has_allocated()");
        goto LAB_00138862;
      }
      iVar37 = (alloc->
               super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
               ).used_.payload_.super_Base<char>.value;
      iVar38 = iVar38 * 0x40 + iVar37;
      (alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).used_.payload_.super_Base<char>.value = iVar38;
      pcVar9 = absl::lts_20250127::log_internal::Check_LEImpl
                         (iVar38,(alloc->
                                 super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                 ).total_.payload_.super_Base<char>.value,
                          "used <= total_.template Get<TypeToUse>()");
      if (pcVar9 != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&lazy_dep_alloc,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1b6,pcVar9);
        goto LAB_00138862;
      }
      pFVar8->services_ = (ServiceDescriptor *)(pcVar3 + iVar37);
      local_1f0 = &(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase;
      lVar41 = 0;
      for (lVar42 = 0; lVar42 < *(int *)((long)&proto->field_0 + 0x58); lVar42 = lVar42 + 1) {
        pVVar21 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                            (local_1f0,(int)lVar42);
        pFVar8 = result;
        BuildService(this,pVVar21,extraout_RDX,
                     (ServiceDescriptor *)(&result->services_->super_SymbolBase + lVar41),alloc);
        lVar41 = lVar41 + 0x40;
      }
      iVar38 = *(int *)((long)&proto->field_0 + 0x70);
      pFVar8->extension_count_ = iVar38;
      pFVar22 = anon_unknown_24::
                FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ::AllocateArray<google::protobuf::FieldDescriptor>
                          (&alloc->
                            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           ,iVar38);
      pFVar8->extensions_ = pFVar22;
      local_1e8 = &(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase;
      lVar41 = 0;
      for (lVar42 = 0; lVar42 < *(int *)((long)&proto->field_0 + 0x70); lVar42 = lVar42 + 1) {
        pVVar23 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                            (local_1e8,(int)lVar42);
        pFVar8 = result;
        BuildExtension(this,pVVar23,(Descriptor *)0x0,
                       (FieldDescriptor *)(&result->extensions_->super_SymbolBase + lVar41),alloc);
        lVar41 = lVar41 + 0x58;
      }
      AllocateOptions(this,proto,pFVar8,alloc);
      pFVar8 = result;
      local_238 = result;
      CrossLinkFile(this,result,proto);
      bVar5 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
              ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
                       *)&this->message_hints_);
      if (!bVar5) {
        SuggestFieldNumbers(this,pFVar8,proto_00);
      }
      bVar44 = this->had_errors_;
      if ((bool)bVar44 == false) {
        OptionInterpreter::OptionInterpreter((OptionInterpreter *)&lazy_dep_alloc,this);
        for (pOVar43 = (this->options_to_interpret_).
                       super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pOVar43 !=
            (this->options_to_interpret_).
            super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
            ._M_impl.super__Vector_impl_data._M_finish; pOVar43 = pOVar43 + 1) {
          OptionInterpreter::InterpretOptionsImpl((OptionInterpreter *)&lazy_dep_alloc,pOVar43,true)
          ;
        }
        uVar1 = *(undefined1 *)(in_FS_OFFSET + -0x60);
        *(undefined1 *)(in_FS_OFFSET + -0x60) = 0;
        local_208.inner_.ctrl_ = (ctrl_t *)this;
        local_208.inner_.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)alloc;
        ResolveFeatures(this,proto,pFVar8,pFVar8->options_,alloc);
        paVar34 = extraout_RDX_00;
        for (iVar38 = 0; iVar38 < pFVar8->message_type_count_; iVar38 = iVar38 + 1) {
          pDVar17 = FileDescriptor::message_type(pFVar8,iVar38);
          pVVar18 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                              ((RepeatedPtrFieldBase *)local_228,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
          ::Visit<google::protobuf::DescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
                      *)&local_208,pDVar17,pVVar18);
          paVar34 = extraout_RDX_01;
        }
        for (iVar38 = 0; iVar38 < pFVar8->enum_type_count_; iVar38 = iVar38 + 1) {
          pEVar19 = FileDescriptor::enum_type(pFVar8,iVar38);
          pVVar20 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                              (local_220,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
          ::Visit<google::protobuf::EnumDescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
                      *)&local_208,pEVar19,pVVar20);
          paVar34 = extraout_RDX_02;
        }
        for (iVar38 = 0; iVar38 < pFVar8->extension_count_; iVar38 = iVar38 + 1) {
          pFVar22 = FileDescriptor::extension(pFVar8,iVar38);
          pVVar23 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                              (local_1e8,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
          ::Visit<google::protobuf::FieldDescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
                      *)&local_208,pFVar22,pVVar23);
          paVar34 = extraout_RDX_03;
        }
        for (iVar38 = 0; iVar38 < pFVar8->service_count_; iVar38 = iVar38 + 1) {
          pSVar25 = FileDescriptor::service(pFVar8,iVar38);
          pVVar21 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                              (local_1f0,iVar38);
          ResolveFeatures<google::protobuf::ServiceDescriptor>
                    (this,pVVar21,pSVar25,pSVar25->options_,alloc);
          paVar34 = extraout_RDX_04;
          for (iVar37 = 0; iVar37 < pSVar25->method_count_; iVar37 = iVar37 + 1) {
            pMVar26 = ServiceDescriptor::method(pSVar25,iVar37);
            pVVar27 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                (&(pVVar21->field_0)._impl_.method_.super_RepeatedPtrFieldBase,
                                 iVar37);
            ResolveFeatures<google::protobuf::MethodDescriptor>
                      (this,pVVar27,pMVar26,pMVar26->options_,alloc);
            paVar34 = extraout_RDX_05;
          }
        }
        *(undefined1 *)(in_FS_OFFSET + -0x60) = uVar1;
        local_208.inner_.ctrl_ = (ctrl_t *)this;
        for (iVar38 = 0; iVar38 < pFVar8->message_type_count_; iVar38 = iVar38 + 1) {
          pDVar17 = FileDescriptor::message_type(pFVar8,iVar38);
          pVVar18 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                              ((RepeatedPtrFieldBase *)local_228,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_4>>
          ::Visit<google::protobuf::DescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__4>>
                      *)&local_208,pDVar17,pVVar18);
          paVar34 = extraout_RDX_06;
        }
        for (iVar38 = 0; iVar38 < pFVar8->enum_type_count_; iVar38 = iVar38 + 1) {
          pEVar19 = FileDescriptor::enum_type(pFVar8,iVar38);
          pVVar20 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                              (local_220,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_4>>
          ::Visit<google::protobuf::EnumDescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__4>>
                      *)pEVar19,(EnumDescriptor *)pVVar20,proto_01);
          paVar34 = extraout_RDX_07;
        }
        for (iVar38 = 0; iVar38 < pFVar8->extension_count_; iVar38 = iVar38 + 1) {
          pFVar22 = FileDescriptor::extension(pFVar8,iVar38);
          pVVar23 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                              (local_1e8,iVar38);
          PostProcessFieldFeatures(this,pFVar22,pVVar23);
          paVar34 = extraout_RDX_08;
        }
        for (iVar38 = 0; iVar38 < pFVar8->service_count_; iVar38 = iVar38 + 1) {
          pSVar25 = FileDescriptor::service(pFVar8,iVar38);
          pVVar21 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                              (local_1f0,iVar38);
          paVar34 = extraout_RDX_09;
          for (iVar37 = 0; iVar37 < pSVar25->method_count_; iVar37 = iVar37 + 1) {
            ServiceDescriptor::method(pSVar25,iVar37);
            internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                      (&(pVVar21->field_0)._impl_.method_.super_RepeatedPtrFieldBase,iVar37);
            paVar34 = extraout_RDX_10;
          }
        }
        for (pOVar43 = (this->options_to_interpret_).
                       super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            __last = (this->options_to_interpret_).
                     super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                     ._M_impl.super__Vector_impl_data._M_finish, pOVar43 != __last;
            pOVar43 = pOVar43 + 1) {
          OptionInterpreter::InterpretOptionsImpl
                    ((OptionInterpreter *)&lazy_dep_alloc,pOVar43,false);
          paVar34 = extraout_RDX_11;
        }
        __first = (this->options_to_interpret_).
                  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pOVar43 != __first) {
          std::
          _Destroy<google::protobuf::(anonymous_namespace)::OptionsToInterpret*,google::protobuf::(anonymous_namespace)::OptionsToInterpret>
                    (__first,__last,paVar34);
          (this->options_to_interpret_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
          ._M_impl.super__Vector_impl_data._M_finish = __first;
        }
        if (info != (SourceCodeInfo *)0x0) {
          OptionInterpreter::UpdateSourceCodeInfo((OptionInterpreter *)&lazy_dep_alloc,info);
        }
        OptionInterpreter::~OptionInterpreter((OptionInterpreter *)&lazy_dep_alloc);
        bVar44 = this->had_errors_;
      }
      if (((bVar44 & 1) == 0) && (this->pool_->lazily_build_dependencies_ == false)) {
        lazy_dep_alloc.
        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        .pointers_.payload_.super_Base<char>.value = (PointerT<char>)this;
        ValidateOptions(this,pFVar8,proto);
        for (iVar38 = 0; iVar38 < pFVar8->message_type_count_; iVar38 = iVar38 + 1) {
          pDVar17 = FileDescriptor::message_type(pFVar8,iVar38);
          pVVar18 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                              ((RepeatedPtrFieldBase *)local_228,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_5>>
          ::Visit<google::protobuf::DescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__5>>
                      *)&lazy_dep_alloc,pDVar17,pVVar18);
        }
        for (iVar38 = 0; iVar38 < pFVar8->enum_type_count_; iVar38 = iVar38 + 1) {
          pEVar19 = FileDescriptor::enum_type(pFVar8,iVar38);
          pVVar20 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                              (local_220,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_5>>
          ::Visit<google::protobuf::EnumDescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__5>>
                      *)&lazy_dep_alloc,pEVar19,pVVar20);
        }
        for (iVar38 = 0; iVar38 < pFVar8->extension_count_; iVar38 = iVar38 + 1) {
          pFVar22 = FileDescriptor::extension(pFVar8,iVar38);
          pVVar23 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                              (local_1e8,iVar38);
          ValidateOptions(this,pFVar22,pVVar23);
        }
        for (iVar38 = 0; iVar38 < pFVar8->service_count_; iVar38 = iVar38 + 1) {
          pSVar25 = FileDescriptor::service(pFVar8,iVar38);
          pVVar21 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                              (local_1f0,iVar38);
          ValidateOptions(this,pSVar25,pVVar21);
          for (iVar37 = 0; iVar37 < pSVar25->method_count_; iVar37 = iVar37 + 1) {
            ServiceDescriptor::method(pSVar25,iVar37);
            internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                      (&(pVVar21->field_0)._impl_.method_.super_RepeatedPtrFieldBase,iVar37);
          }
        }
        bVar44 = this->had_errors_;
      }
      if ((bVar44 & 1) != 0) {
        for (iVar38 = 0; iVar38 < *(int *)((long)&proto->field_0 + 0x28); iVar38 = iVar38 + 1) {
          pDVar17 = FileDescriptor::message_type(pFVar8,iVar38);
          pVVar18 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                              ((RepeatedPtrFieldBase *)local_228,iVar38);
          DetectMapConflicts(this,pDVar17,pVVar18);
        }
        bVar44 = this->had_errors_;
      }
      if ((((bVar44 & 1) == 0) &&
          (bVar5 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ::empty((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            *)local_1f8), !bVar5)) &&
         (this->pool_->lazily_build_dependencies_ == false)) {
        LogUnusedDependency(this,proto,result_00);
      }
      bVar44 = this->had_errors_;
      if (((bool)bVar44 == false) && (this->pool_->lazily_build_dependencies_ == false)) {
        local_208.inner_.ctrl_ = (ctrl_t *)this;
        local_208.inner_.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)proto;
        if (pFVar8->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_) {
          lazy_dep_alloc.
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          .pointers_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value =
               (PointerT<google::protobuf::FileDescriptorTables>)(pFVar8->name_->_M_dataplus)._M_p;
          lazy_dep_alloc.
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          .pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
               (PointerT<google::protobuf::SourceCodeInfo>)pFVar8->name_->_M_string_length;
          puVar16 = (undefined8 *)
                    ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
          lazy_dep_alloc.
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          .pointers_.payload_.super_Base<google::protobuf::MessageOptions>.value =
               (PointerT<google::protobuf::MessageOptions>)*puVar16;
          lazy_dep_alloc.
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          .pointers_.payload_.super_Base<google::protobuf::FeatureSet>.value =
               (PointerT<google::protobuf::FeatureSet>)puVar16[1];
          lazy_dep_alloc.
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          .pointers_.payload_.
          super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .value = (PointerT<std::__cxx11::basic_string<char>_>)proto;
          lazy_dep_alloc.
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          .pointers_.payload_.super_Base<char>.value = (PointerT<char>)pFVar8->proto_features_;
          dependency = pFVar8;
          pvVar28 = absl::lts_20250127::container_internal::
                    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                    ::
                    operator[]<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>
                              ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                                *)&this->deferred_validation_->lifetimes_info_map_,&dependency);
          std::
          vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
          ::emplace_back<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                    (pvVar28,(LifetimesInfo *)&lazy_dep_alloc);
        }
        for (iVar38 = 0; iVar38 < pFVar8->message_type_count_; iVar38 = iVar38 + 1) {
          pDVar17 = FileDescriptor::message_type(pFVar8,iVar38);
          pVVar18 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                              ((RepeatedPtrFieldBase *)local_228,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
          ::Visit<google::protobuf::DescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                      *)&local_208,pDVar17,pVVar18);
        }
        for (iVar38 = 0; iVar38 < pFVar8->enum_type_count_; iVar38 = iVar38 + 1) {
          pEVar19 = FileDescriptor::enum_type(pFVar8,iVar38);
          pVVar20 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                              (local_220,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
          ::Visit<google::protobuf::EnumDescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                      *)&local_208,pEVar19,pVVar20);
        }
        for (iVar38 = 0; iVar38 < pFVar8->extension_count_; iVar38 = iVar38 + 1) {
          pFVar22 = FileDescriptor::extension(pFVar8,iVar38);
          pVVar23 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                              (local_1e8,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_6>>
          ::Visit<google::protobuf::FieldDescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__6>>
                      *)&local_208,pFVar22,pVVar23);
        }
        iVar38 = 0;
        while (iVar38 < pFVar8->service_count_) {
          local_1f8 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FileDescriptor_const*>>
                       *)CONCAT44(local_1f8._4_4_,iVar38);
          pSVar25 = FileDescriptor::service(pFVar8,iVar38);
          BVar29.value = (PointerT<std::__cxx11::basic_string<char>_>)
                         internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                                   (local_1f0,(int)local_1f8);
          if (pSVar25->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_) {
            pcVar40 = (pSVar25->all_names_).payload_;
            dependency = pSVar25->file_;
            lazy_dep_alloc.
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            .pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
                 (PointerT<google::protobuf::SourceCodeInfo>)(ulong)*(ushort *)(pcVar40 + 2);
            puVar16 = (undefined8 *)
                      ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
            lazy_dep_alloc.
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            .pointers_.payload_.super_Base<google::protobuf::MessageOptions>.value =
                 (PointerT<google::protobuf::MessageOptions>)*puVar16;
            lazy_dep_alloc.
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            .pointers_.payload_.super_Base<google::protobuf::FeatureSet>.value =
                 (PointerT<google::protobuf::FeatureSet>)puVar16[1];
            lazy_dep_alloc.
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            .pointers_.payload_.
            super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .value = BVar29.value;
            lazy_dep_alloc.
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            .pointers_.payload_.super_Base<char>.value = (PointerT<char>)pSVar25->proto_features_;
            lazy_dep_alloc.
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            .pointers_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value =
                 (PointerT<google::protobuf::FileDescriptorTables>)
                 (pcVar40 +
                 ~(ulong)lazy_dep_alloc.
                         super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                         .pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value);
            pvVar28 = absl::lts_20250127::container_internal::
                      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                      ::
                      operator[]<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>
                                ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                                  *)&this->deferred_validation_->lifetimes_info_map_,&dependency);
            std::
            vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
            ::emplace_back<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                      (pvVar28,(LifetimesInfo *)&lazy_dep_alloc);
          }
          for (iVar38 = 0; iVar38 < pSVar25->method_count_; iVar38 = iVar38 + 1) {
            pMVar26 = ServiceDescriptor::method(pSVar25,iVar38);
            BVar30.value = (PointerT<std::__cxx11::basic_string<char>_>)
                           internal::RepeatedPtrFieldBase::
                           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                     (&(((anon_union_48_1_493b367e_for_ServiceDescriptorProto_3 *)
                                        &(BVar29.value)->field_2)->_impl_).method_.
                                       super_RepeatedPtrFieldBase,iVar38);
            if (pMVar26->proto_features_ != (FeatureSet *)_FeatureSet_default_instance_) {
              pcVar40 = (pMVar26->all_names_).payload_;
              dependency = pMVar26->service_->file_;
              lazy_dep_alloc.
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              .pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
                   (PointerT<google::protobuf::SourceCodeInfo>)(ulong)*(ushort *)(pcVar40 + 2);
              puVar16 = (undefined8 *)
                        ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
              ;
              lazy_dep_alloc.
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              .pointers_.payload_.super_Base<google::protobuf::MessageOptions>.value =
                   (PointerT<google::protobuf::MessageOptions>)*puVar16;
              lazy_dep_alloc.
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              .pointers_.payload_.super_Base<google::protobuf::FeatureSet>.value =
                   (PointerT<google::protobuf::FeatureSet>)puVar16[1];
              lazy_dep_alloc.
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              .pointers_.payload_.
              super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .value = BVar30.value;
              lazy_dep_alloc.
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              .pointers_.payload_.super_Base<char>.value = (PointerT<char>)pMVar26->proto_features_;
              lazy_dep_alloc.
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              .pointers_.payload_.super_Base<google::protobuf::FileDescriptorTables>.value =
                   (PointerT<google::protobuf::FileDescriptorTables>)
                   (pcVar40 +
                   ~(ulong)lazy_dep_alloc.
                           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                           .pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value);
              pvVar28 = absl::lts_20250127::container_internal::
                        raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                        ::
                        operator[]<google::protobuf::FileDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>
                                  ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
                                    *)&this->deferred_validation_->lifetimes_info_map_,&dependency);
              std::
              vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
              ::emplace_back<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>
                        (pvVar28,(LifetimesInfo *)&lazy_dep_alloc);
            }
          }
          iVar38 = (int)local_1f8 + 1;
        }
        bVar44 = this->had_errors_;
      }
      if (((bVar44 & 1) == 0) && (this->pool_->enforce_naming_style_ == true)) {
        lazy_dep_alloc.
        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
        .pointers_.payload_.super_Base<char>.value = (PointerT<char>)this;
        if ((pFVar8->merged_features_->field_0)._impl_.enforce_naming_style_ == 1) {
          ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>
                    (this,pFVar8,proto);
        }
        for (iVar38 = 0; iVar38 < pFVar8->message_type_count_; iVar38 = iVar38 + 1) {
          pDVar17 = FileDescriptor::message_type(pFVar8,iVar38);
          pVVar18 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                              ((RepeatedPtrFieldBase *)local_228,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_7>>
          ::Visit<google::protobuf::DescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>>
                      *)&lazy_dep_alloc,pDVar17,pVVar18);
        }
        for (iVar38 = 0; iVar38 < pFVar8->enum_type_count_; iVar38 = iVar38 + 1) {
          pEVar19 = FileDescriptor::enum_type(pFVar8,iVar38);
          pVVar20 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                              (local_220,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_7>>
          ::Visit<google::protobuf::EnumDescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>>
                      *)&lazy_dep_alloc,pEVar19,pVVar20);
        }
        for (iVar38 = 0; iVar38 < pFVar8->extension_count_; iVar38 = iVar38 + 1) {
          pFVar22 = FileDescriptor::extension(pFVar8,iVar38);
          pVVar23 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                              (local_1e8,iVar38);
          internal::
          VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_7>>
          ::Visit<google::protobuf::FieldDescriptorProto_const>
                    ((VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__7>>
                      *)&lazy_dep_alloc,pFVar22,pVVar23);
        }
        for (iVar38 = 0; iVar38 < pFVar8->service_count_; iVar38 = iVar38 + 1) {
          pSVar25 = FileDescriptor::service(pFVar8,iVar38);
          pVVar21 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                              (local_1f0,iVar38);
          if ((pSVar25->merged_features_->field_0)._impl_.enforce_naming_style_ == 1) {
            ValidateNamingStyle<google::protobuf::ServiceDescriptor,google::protobuf::ServiceDescriptorProto>
                      (this,pSVar25,pVVar21);
          }
          for (iVar37 = 0; iVar37 < pSVar25->method_count_; iVar37 = iVar37 + 1) {
            pMVar26 = ServiceDescriptor::method(pSVar25,iVar37);
            pVVar27 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MethodDescriptorProto>>
                                (&(pVVar21->field_0)._impl_.method_.super_RepeatedPtrFieldBase,
                                 iVar37);
            if ((pMVar26->merged_features_->field_0)._impl_.enforce_naming_style_ == 1) {
              ValidateNamingStyle<google::protobuf::MethodDescriptor,google::protobuf::MethodDescriptorProto>
                        (this,pMVar26,pVVar27);
            }
          }
        }
        bVar44 = this->had_errors_;
        local_238 = result;
      }
      if ((bVar44 & 1) == 0) {
        CheckVisibilityRules(this,local_238,proto);
        if ((this->had_errors_ & 1U) != 0) {
          local_238 = (FileDescriptor *)0x0;
        }
      }
      else {
LAB_00138789:
        local_238 = (FileDescriptor *)0x0;
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::~raw_hash_set(&weak_deps.
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                     );
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~raw_hash_set(&seen_dependencies.
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
      goto LAB_00137535;
    }
    puVar16 = (undefined8 *)
              ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar33 = (pointer)*puVar16;
    sVar36 = puVar16[1];
    pcVar40 = "A file with this name is already in the pool.";
    location = OTHER;
LAB_00137529:
    element_name_01._M_str = pcVar33;
    element_name_01._M_len = sVar36;
    AddError(this,element_name_01,&proto->super_Message,location,pcVar40);
  }
  local_238 = (FileDescriptor *)0x0;
LAB_00137535:
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
  ~StatusOrData(&feature_resolver.super_StatusOrData<google::protobuf::FeatureResolver>);
  return local_238;
}

Assistant:

FileDescriptor* DescriptorBuilder::BuildFileImpl(
    const FileDescriptorProto& proto, internal::FlatAllocator& alloc) {
  FileDescriptor* result = alloc.AllocateArray<FileDescriptor>(1);
  file_ = result;

  if (proto.has_edition()) {
    file_->edition_ = proto.edition();
  } else if (proto.syntax().empty() || proto.syntax() == "proto2") {
    file_->edition_ = Edition::EDITION_PROTO2;
  } else if (proto.syntax() == "proto3") {
    file_->edition_ = Edition::EDITION_PROTO3;
  } else {
    file_->edition_ = Edition::EDITION_UNKNOWN;
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER, [&] {
      return absl::StrCat("Unrecognized syntax: ", proto.syntax());
    });
  }

  const FeatureSetDefaults& defaults = pool_->GetFeatureSetDefaults();

  absl::StatusOr<FeatureResolver> feature_resolver =
      FeatureResolver::Create(file_->edition_, defaults);
  if (!feature_resolver.ok()) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::EDITIONS,
             [&] { return std::string(feature_resolver.status().message()); });
  } else {
    feature_resolver_.emplace(std::move(feature_resolver).value());
  }

  result->is_placeholder_ = false;
  result->finished_building_ = false;
  SourceCodeInfo* info = nullptr;
  if (proto.has_source_code_info()) {
    info = alloc.AllocateArray<SourceCodeInfo>(1);
    *info = proto.source_code_info();
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = alloc.AllocateArray<FileDescriptorTables>(1);
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  result->name_ = alloc.AllocateStrings(proto.name());
  if (proto.has_package()) {
    result->package_ = alloc.AllocateStrings(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = alloc.AllocateStrings("");
  }
  result->pool_ = pool_;

  if (absl::StrContains(result->name(), '\0')) {
    AddError(result->name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", result->name(), "\" contains null character.");
    });
    return nullptr;
  }

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    return nullptr;
  }
  if (!result->package().empty()) {
    if (std::count(result->package().begin(), result->package().end(), '.') >
        kPackageLimit) {
      AddError(result->package(), proto, DescriptorPool::ErrorCollector::NAME,
               "Exceeds Maximum Package Depth");
      return nullptr;
    }
    AddPackage(result->package(), proto, result, true);
  }

  // Make sure all dependencies are loaded.
  absl::flat_hash_set<absl::string_view> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
      alloc.AllocateArray<const FileDescriptor*>(proto.dependency_size());
  result->dependencies_once_ = nullptr;
  unused_dependency_.clear();
  absl::flat_hash_set<int> weak_deps;
  for (int i = 0; i < proto.weak_dependency_size(); ++i) {
    weak_deps.insert(proto.weak_dependency(i));
  }

  bool need_lazy_deps = false;
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddTwiceListedError(proto, i);
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == nullptr && pool_->underlay_ != nullptr) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == result) {
      // Recursive import.  dependency/result is not fully initialized, and it's
      // dangerous to try to do anything with it.  The recursive import error
      // will be detected and reported in DescriptorBuilder::BuildFile().
      return nullptr;
    }

    if (dependency == nullptr) {
      if (!pool_->lazily_build_dependencies_) {
        if (pool_->allow_unknown_ ||
            (!pool_->enforce_weak_ && weak_deps.contains(i))) {
          internal::FlatAllocator lazy_dep_alloc;
          lazy_dep_alloc.PlanArray<FileDescriptor>(1);
          lazy_dep_alloc.PlanArray<std::string>(1);
          lazy_dep_alloc.FinalizePlanning(tables_);
          dependency = pool_->NewPlaceholderFileWithMutexHeld(
              proto.dependency(i), lazy_dep_alloc);
        } else {
          AddImportError(proto, i);
        }
      }
    } else {
      // Add to unused_dependency_ to track unused imported files.
      // Note: do not track unused imported files for public import.
      if (pool_->enforce_dependencies_ &&
          (pool_->direct_input_files_.find(proto.name()) !=
           pool_->direct_input_files_.end()) &&
          (dependency->public_dependency_count() == 0)) {
        unused_dependency_.insert(dependency);
      }
    }

    result->dependencies_[i] = dependency;
    if (pool_->lazily_build_dependencies_ && !dependency) {
      need_lazy_deps = true;
    }
  }
  if (need_lazy_deps) {
    int total_char_size = 0;
    for (int i = 0; i < proto.dependency_size(); i++) {
      if (result->dependencies_[i] == nullptr) {
        total_char_size += static_cast<int>(proto.dependency(i).size());
      }
      ++total_char_size;  // For NUL char
    }

    void* data = tables_->AllocateBytes(
        static_cast<int>(sizeof(absl::once_flag)) + total_char_size);
    result->dependencies_once_ = ::new (data) absl::once_flag{};
    char* name_data = reinterpret_cast<char*>(result->dependencies_once_ + 1);

    for (int i = 0; i < proto.dependency_size(); i++) {
      if (result->dependencies_[i] == nullptr) {
        memcpy(name_data, proto.dependency(i).data(),
               proto.dependency(i).size());
        name_data += proto.dependency(i).size();
      }
      *name_data++ = '\0';
    }
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ =
      alloc.AllocateArray<int>(proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
      // Do not track unused imported files for public import.
      // Calling dependency(i) builds that file when doing lazy imports,
      // need to avoid doing this. Unused dependency detection isn't done
      // when building lazily, anyways.
      if (!pool_->lazily_build_dependencies_) {
        unused_dependency_.erase(result->dependency(index));
      }
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  // We don't/can't do proper dependency error checking when
  // lazily_build_dependencies_, and calling dependency(i) will force
  // a dependency to be built, which we don't want.
  if (!pool_->lazily_build_dependencies_) {
    for (int i = 0; i < result->dependency_count(); i++) {
      RecordPublicDependencies(result->dependency(i));
    }
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ =
      alloc.AllocateArray<int>(proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage, nullptr);
  BUILD_ARRAY(proto, result, enum_type, BuildEnum, nullptr);
  BUILD_ARRAY(proto, result, service, BuildService, nullptr);
  BUILD_ARRAY(proto, result, extension, BuildExtension, nullptr);

  // Copy options.
  AllocateOptions(proto, result, alloc);

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  if (!message_hints_.empty()) {
    SuggestFieldNumbers(result, proto);
  }

  // Interpret only the non-extension options first, including features and
  // their extensions.  This has to be done in two passes, since option
  // extensions defined in this file may have features attached to them.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretNonExtensionOptions(&(*iter));
    }

    // Handle feature resolution.  This must occur after option interpretation,
    // but before validation.
    {
      auto cleanup = DisableTracking();
      internal::VisitDescriptors(
          *result, proto, [&](const auto& descriptor, const auto& proto) {
            using OptionsT =
                typename std::remove_const<typename std::remove_pointer<
                    decltype(descriptor.options_)>::type>::type;
            using DescriptorT =
                typename std::remove_const<typename std::remove_reference<
                    decltype(descriptor)>::type>::type;

            ResolveFeatures(
                proto, const_cast<DescriptorT*>(&descriptor),
                const_cast<  // NOLINT(google3-runtime-proto-const-cast)
                    OptionsT*>(descriptor.options_),
                alloc);
          });
    }

    // Post-process cleanup for field features.
    internal::VisitDescriptors(
        *result, proto,
        [&](const FieldDescriptor& field, const FieldDescriptorProto& proto) {
          PostProcessFieldFeatures(const_cast<FieldDescriptor&>(field), proto);
        });

    // Interpret any remaining uninterpreted options gathered into
    // options_to_interpret_ during descriptor building.  Cross-linking has made
    // extension options known, so all interpretations should now succeed.
    for (std::vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptionExtensions(&(*iter));
    }
    options_to_interpret_.clear();
    if (info != nullptr) {
      option_interpreter.UpdateSourceCodeInfo(info);
    }
  }

  // Validate options. See comments at InternalSetLazilyBuildDependencies about
  // error checking and lazy import building.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          ValidateOptions(&descriptor, desc_proto);
        });
  }

  // Additional naming conflict check for map entry types. Only need to check
  // this if there are already errors.
  if (had_errors_) {
    for (int i = 0; i < proto.message_type_size(); ++i) {
      DetectMapConflicts(result->message_type(i), proto.message_type(i));
    }
  }


  // Again, see comments at InternalSetLazilyBuildDependencies about error
  // checking. Also, don't log unused dependencies if there were previous
  // errors, since the results might be inaccurate.
  if (!had_errors_ && !unused_dependency_.empty() &&
      !pool_->lazily_build_dependencies_) {
    LogUnusedDependency(proto, result);
  }

  // Store feature information for deferred validation outside of the database
  // mutex.
  if (!had_errors_ && !pool_->lazily_build_dependencies_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          if (descriptor.proto_features_ != &FeatureSet::default_instance()) {
            deferred_validation_.ValidateFeatureLifetimes(
                GetFile(descriptor), {descriptor.proto_features_, &desc_proto,
                                      GetFullName(descriptor), proto.name()});
          }
        });
  }

  if (!had_errors_ && pool_->enforce_naming_style_) {
    internal::VisitDescriptors(
        *result, proto, [&](const auto& descriptor, const auto& desc_proto) {
          if (internal::InternalFeatureHelper::GetFeatures(descriptor)
                  .enforce_naming_style() == FeatureSet::STYLE2024) {
            ValidateNamingStyle(&descriptor, desc_proto);
          }
        });
  }
  if (!had_errors_) {
    // Check Symbol Visibility Rules.
    CheckVisibilityRules(result, proto);
  }

  if (had_errors_) {
    return nullptr;
  } else {
    return result;
  }
}